

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_a2c9b3::RateRepresentationPredicate::Rate
          (RateRepresentationPredicate *this,IfcRepresentation *r)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  const_reference this_00;
  IfcRepresentationItem *pIVar3;
  IfcMappedItem *pIVar4;
  IfcRepresentationMap *pIVar5;
  IfcRepresentation *r_00;
  IfcMappedItem *m;
  string *name;
  IfcRepresentation *r_local;
  RateRepresentationPredicate *this_local;
  
  bVar1 = Assimp::STEP::
          Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator!((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&(r->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                        field_0x18);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    __lhs = Assimp::STEP::
            Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&(r->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                      field_0x18);
    bVar1 = std::operator==(__lhs,"MappedRepresentation");
    if (bVar1) {
      bVar1 = std::
              vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
              ::empty(&(r->Items).
                       super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                     );
      if (!bVar1) {
        this_00 = std::
                  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                  ::front(&(r->Items).
                           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                         );
        pIVar3 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>::operator->
                           (this_00);
        pIVar4 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcMappedItem>
                           ((Object *)
                            ((long)&(pIVar3->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                    )._vptr_ObjectHelper +
                            (long)(pIVar3->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  )._vptr_ObjectHelper[-3]));
        if (pIVar4 != (IfcMappedItem *)0x0) {
          pIVar5 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                             ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)
                              &(pIVar4->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                               field_0x10);
          r_00 = Assimp::STEP::Lazy::operator_cast_to_IfcRepresentation_
                           ((Lazy *)&(pIVar5->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                     ).field_0x20);
          iVar2 = Rate(this,r_00);
          return iVar2;
        }
      }
      this_local._4_4_ = 100;
    }
    else {
      this_local._4_4_ = Rate(this,__lhs);
    }
  }
  return this_local._4_4_;
}

Assistant:

int Rate(const Schema_2x3::IfcRepresentation* r) const {
        // the smaller, the better

        if (! r->RepresentationIdentifier) {
            // neutral choice if no extra information is specified
            return 0;
        }


        const std::string& name = r->RepresentationIdentifier.Get();
        if (name == "MappedRepresentation") {
            if (!r->Items.empty()) {
                // take the first item and base our choice on it
                const Schema_2x3::IfcMappedItem* const m = r->Items.front()->ToPtr<Schema_2x3::IfcMappedItem>();
                if (m) {
                    return Rate(m->MappingSource->MappedRepresentation);
                }
            }
            return 100;
        }

        return Rate(name);
    }